

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O1

void __thiscall UUID_BadHex_Test::~UUID_BadHex_Test(UUID_BadHex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (UUID, BadHex) {
    // '/' is one behind '0' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("/0000000-0000-0000-0000-000000000000").has_value ());
    // ':' is one past '9' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string (":0000000-0000-0000-0000-000000000000").has_value ());
    // '@' is one behind 'A' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("@0000000-0000-0000-0000-000000000000").has_value ());
    // 'G' is one past 'F'. Too obvious?
    EXPECT_FALSE (pstore::uuid::from_string ("G0000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("0G000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("g0000000-0000-0000-0000-000000000000").has_value ());
    EXPECT_FALSE (pstore::uuid::from_string ("0g000000-0000-0000-0000-000000000000").has_value ());
    // '`' is one behind 'a' in ASCII
    EXPECT_FALSE (pstore::uuid::from_string ("`0000000-0000-0000-0000-000000000000").has_value ());
}